

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::diversify(Solver *this,int rank,int size)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Restart local_50;
  Restart local_30;
  int local_c;
  
  if ((in_ESI == 0) || ((in_ESI == 1 && (2 < in_EDX)))) {
    *(undefined1 *)(in_RDI + 0x701) = 0;
  }
  if (in_ESI == 1) {
    *(undefined1 *)(in_RDI + 0x7e0) = 0;
    *(undefined8 *)(in_RDI + 0x800) = 1000000000;
  }
  if (1 < in_ESI) {
    if (in_ESI % 3 == 2) {
      *(undefined1 *)(in_RDI + 0x88) = 1;
    }
    local_c = in_ESI;
    if (in_ESI % 5 == 2) {
      Restart::Restart(&local_30,0);
      *(uint64_t *)(in_RDI + 0x198) = local_30.savedDecisions;
      *(uint64_t *)(in_RDI + 0x1a0) = local_30.savedPropagations;
      *(uint64_t *)(in_RDI + 0x1a8) = local_30.partialRestarts;
      *(uint32_t *)(in_RDI + 0x1b0) = local_30.selection_type;
    }
    if (local_c % 5 == 3) {
      Restart::Restart(&local_50,1);
      *(uint64_t *)(in_RDI + 0x198) = local_50.savedDecisions;
      *(uint64_t *)(in_RDI + 0x1a0) = local_50.savedPropagations;
      *(uint64_t *)(in_RDI + 0x1a8) = local_50.partialRestarts;
      *(uint32_t *)(in_RDI + 0x1b0) = local_50.selection_type;
    }
    if (local_c % 7 == 3) {
      *(undefined4 *)(in_RDI + 0x4b8) = 4;
    }
    if (local_c % 0xb == 4) {
      *(undefined4 *)(in_RDI + 0x8c) = 2;
    }
    if (local_c % 0xb == 7) {
      *(undefined4 *)(in_RDI + 0x8c) = 3;
    }
    if (local_c % 0xd == 8) {
      *(undefined4 *)(in_RDI + 0x58) = 100000;
      *(undefined4 *)(in_RDI + 0x5c) = 100000;
    }
    if (local_c % 0x11 == 4) {
      *(undefined8 *)(in_RDI + 0x60) = 0x3feff7ced916872b;
    }
    if (local_c % 0x13 == 6) {
      *(undefined8 *)(in_RDI + 0x610) = 2000;
      *(undefined4 *)(in_RDI + 0x61c) = 1;
    }
    if (local_c % 0x13 == 9) {
      *(undefined8 *)(in_RDI + 0x610) = 3000;
      *(undefined4 *)(in_RDI + 0x61c) = 2;
    }
    if (local_c % 0x17 == 5) {
      *(undefined8 *)(in_RDI + 0x528) = 10;
    }
    if (local_c % 0x17 == 6) {
      *(undefined8 *)(in_RDI + 0x528) = 5;
    }
    if (local_c % 0x1d == 6) {
      *(undefined8 *)(in_RDI + 0x800) = 1000;
    }
    if (local_c % 0x1d == 8) {
      *(undefined8 *)(in_RDI + 0x800) = 3000;
    }
    if (local_c % 0x1d == 10) {
      *(undefined8 *)(in_RDI + 0x800) = 5000;
    }
  }
  return;
}

Assistant:

void Solver::diversify(int rank, int size)
{
    /* rank ranges from 0 to size-1 */

    /* keep first 2 configurations as is, and do not receive clause! */
    if (rank == 0 || (rank == 1 && size > 2)) {
        receiveClauses = false;
    }
    if (rank == 1) {
        use_ccnr = false;
        state_change_time = 1000000000;
    }
    if (rank < 2) return;

    /* allow many combinations of configurations for large ranks! */
    if (rank % 3 == 2) invert_pol = true;
    if (rank % 5 == 2) restart = Restart(0);
    if (rank % 5 == 3) restart = Restart(1);
    if (rank % 7 == 3) core_lbd_cut = 4;
    if (rank % 11 == 4) init_act = 2;
    if (rank % 11 == 7) init_act = 3;
    if (rank % 13 == 8) {
        var_decay_timer = 100000;
        var_decay_timer_init = 100000;
    }
    if (rank % 17 == 4) var_decay = 0.999;
    if (rank % 19 == 6) {
        inprocess_next_lim = 2000;
        inprocess_learnt_level = 1;
    }
    if (rank % 19 == 9) {
        inprocess_next_lim = 3000;
        inprocess_learnt_level = 2;
    }
    if (rank % 23 == 5) chrono = 10;
    if (rank % 23 == 6) chrono = 5;
    if (rank % 29 == 6) state_change_time = 1000;
    if (rank % 29 == 8) state_change_time = 3000;
    if (rank % 29 == 10) state_change_time = 5000;
}